

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SliceDynamicLayerParams::SliceDynamicLayerParams
          (SliceDynamicLayerParams *this)

{
  SliceDynamicLayerParams *pSVar1;
  SliceDynamicLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SliceDynamicLayerParams_00d5a728
  ;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedField<bool>::RepeatedField(&this->beginmasks_);
  google::protobuf::RepeatedField<long>::RepeatedField(&this->endids_);
  google::protobuf::RepeatedField<bool>::RepeatedField(&this->endmasks_);
  google::protobuf::RepeatedField<long>::RepeatedField(&this->strides_);
  google::protobuf::RepeatedField<bool>::RepeatedField(&this->squeezemasks_);
  pSVar1 = internal_default_instance();
  if (this != pSVar1) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

SliceDynamicLayerParams::SliceDynamicLayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.SliceDynamicLayerParams)
}